

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O1

void __thiscall
blockencodings_tests::NonCoinbasePreforwardRTTest::test_method(NonCoinbasePreforwardRTTest *this)

{
  _Atomic_word *p_Var1;
  CTxMemPool *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar4;
  pointer psVar5;
  bool bVar6;
  ReadStatus RVar7;
  int iVar8;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar9;
  long lVar10;
  uint64_t uVar11;
  CTransaction *__tmp;
  size_t *psVar12;
  size_t *psVar13;
  size_t *psVar14;
  char *pcVar15;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *this_02;
  iterator in_R9;
  iterator pvVar16;
  iterator pvVar17;
  CheckBlockFn *pCVar18;
  pointer psVar19;
  pointer psVar20;
  CheckBlockFn *__x;
  long in_FS_OFFSET;
  readonly_property<bool> rVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  check_type cVar25;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 local_890 [48];
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 local_838 [8];
  char *local_830 [2];
  char *local_820 [2];
  undefined1 *local_810;
  header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
  local_808;
  char *local_800;
  char *local_7f8;
  bool mutated;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  pointer local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  _Base_ptr local_730;
  char *local_728;
  _Base_ptr local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  _Base_ptr local_700;
  char *local_6f8;
  _Base_ptr local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  _Base_ptr local_6d0;
  char *local_6c8;
  _Base_ptr local_6c0;
  undefined1 local_6b8 [32];
  CFeeRate local_698;
  CFeeRate local_690;
  char *local_688;
  _Optional_payload_base<unsigned_int> local_680;
  TestMemPoolEntryHelper entry;
  string *local_630;
  string *local_628;
  char *local_620;
  assertion_result local_618;
  string *local_600;
  assertion_result local_5f8;
  string **local_5e0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_5b8 [16];
  shared_count asStack_5a8 [2];
  undefined1 local_598 [32];
  _Alloc_hider local_578;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  undefined1 local_558 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_548;
  CBlock block3;
  PartiallyDownloadedBlock partialBlockCopy;
  CBlock block2;
  CBlockHeaderAndShortTxIDs shortIDs2;
  TestHeaderAndShortIDs shortIDs;
  uint256 txhash;
  PartiallyDownloadedBlock partialBlock;
  CBlock block;
  FastRandomContext rand_ctx;
  assertion_result local_58;
  lazy_ostream *local_40;
  long local_38;
  
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       block3.super_CBlockHeader._0_8_;
  local_6b8._8_8_ = local_6b8._0_8_;
  txhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       txhash.super_base_blob<256U>.m_data._M_elems._0_8_;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  bVar22 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar15 = "m_node.mempool";
  puVar9 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
                      ,0x94,"test_method","m_node.mempool");
  this_00 = (puVar9->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0x0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._1_15_ = SUB1615((undefined1  [16])0x0,1);
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2a;
  FastRandomContext::FastRandomContext(&rand_ctx,(uint256 *)&partialBlock);
  BuildBlockTestCase(&block,&rand_ctx);
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_00->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)&partialBlock,&entry,
             block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&partialBlock);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 4));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&partialBlock.txn_available.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (partialBlock.txn_available.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               partialBlock.txn_available.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_680 = (_Optional_payload_base<unsigned_int>)
              ((long)
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
              + 0x66);
  local_698.nSatoshisPerK = (CAmount)&boost::unit_test::basic_cstring<char_const>::null;
  local_690.nSatoshisPerK = (CAmount)&boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x9b;
  file.m_begin = (iterator)&local_688;
  msg.m_end = in_R9;
  msg.m_begin = pcVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_698,msg);
  shortIDs2.shorttxidk1._0_1_ = 0;
  shortIDs2.shorttxidk0 = (uint64_t)&PTR__lazy_ostream_013d3cb0;
  shortIDs2.nonce = (uint64_t)boost::unit_test::lazy_ostream::inst;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf98c4c;
  CTxMemPool::get((CTxMemPool *)&block3,(uint256 *)this_00);
  if (block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ == 0) {
    lVar10 = 0;
  }
  else {
    lVar10 = (long)*(int *)(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems._4_8_ + 8);
  }
  local_58._0_8_ = &txhash;
  txhash.super_base_blob<256U>.m_data._M_elems[0] = (char)lVar10;
  txhash.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)lVar10 >> 8);
  txhash.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)lVar10 >> 0x10);
  txhash.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)lVar10 >> 0x18);
  txhash.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)lVar10 >> 0x20);
  txhash.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)lVar10 >> 0x28);
  txhash.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)lVar10 >> 0x30);
  txhash.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)lVar10 >> 0x38);
  local_6b8._0_8_ = 4;
  shortIDs.header.nVersion._0_1_ = lVar10 == 4;
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block2.super_CBlockHeader.nVersion._0_1_ = 0x24;
  block2.super_CBlockHeader._1_7_ = 0xe8e5;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x8a;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xe5;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xe8;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4050;
  partialBlock.prefilled_count = (size_t)&local_58;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  partialBlockCopy.prefilled_count = (size_t)&local_5f8;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81(local_6b8,0);
  local_5f8._1_7_ = SUB87((ulong)local_6b8 >> 8,0);
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4050;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar16 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&shortIDs,(lazy_ostream *)&shortIDs2,1,2,REQUIRE,0xe8e5ba,
             (size_t)&block2,0x9b,(CTxMemPoolEntry *)&partialBlock,"SHARED_TX_OFFSET + 0",
             &partialBlockCopy);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  if (block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_);
  }
  txhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  TestHeaderAndShortIDs::TestHeaderAndShortIDs(&shortIDs,&block,&rand_ctx);
  this_02 = &shortIDs.prefilledtxn;
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::resize(this_02,1);
  peVar2 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (shortIDs.prefilledtxn.
   super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
   super__Vector_impl_data._M_start)->index = 1;
  ((shortIDs.prefilledtxn.
    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
    super__Vector_impl_data._M_start)->tx).
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  this_01 = ((shortIDs.prefilledtxn.
              super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
              _M_impl.super__Vector_impl_data._M_start)->tx).
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  ((shortIDs.prefilledtxn.
    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
    super__Vector_impl_data._M_start)->tx).
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&shortIDs.shorttxids,2);
  uVar11 = TestHeaderAndShortIDs::GetShortID
                     (&shortIDs,
                      &(((block.vtx.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->m_witness_hash);
  *shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = uVar11;
  uVar11 = TestHeaderAndShortIDs::GetShortID
                     (&shortIDs,
                      &(block.vtx.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       m_witness_hash);
  shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = uVar11;
  local_6b8._16_16_ = (undefined1  [16])0x0;
  local_6b8._0_16_ = (undefined1  [16])0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&shortIDs.shorttxids;
  SerializeMany<DataStream,CBlockHeader,unsigned_long,Wrapper<VectorFormatter<CustomUintFormatter<6,false>>,std::vector<unsigned_long,std::allocator<unsigned_long>>const&>,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
            ((DataStream *)local_6b8,&shortIDs.header,&shortIDs.nonce,
             (Wrapper<VectorFormatter<CustomUintFormatter<6,_false>_>,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
              *)&partialBlock,this_02);
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.nTime = 0;
  shortIDs2.header.nBits = 0;
  shortIDs2.header.nNonce = 0;
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.nVersion = 0;
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CBlockHeaderAndShortTxIDs::
  SerializationOps<DataStream,CBlockHeaderAndShortTxIDs,ActionUnserialize>(&shortIDs2,local_6b8);
  partialBlock.mempool_count = 0;
  partialBlock.extra_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  partialBlock.header.nVersion = 0;
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.nTime = 0;
  partialBlock.header.nBits = 0;
  partialBlock.header.nNonce = 0;
  partialBlock.m_check_block_mock.super__Function_base._M_functor = (_Any_data)0x0;
  partialBlock.m_check_block_mock.super__Function_base._M_manager = (_Manager_type)0x0;
  partialBlock.m_check_block_mock._M_invoker = (_Invoker_type)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6c0 = (_Base_ptr)0xe8e58a;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xaf;
  file_00.m_begin = (iterator)&local_6c8;
  msg_00.m_end = pvVar16;
  msg_00.m_begin = (iterator)this_02;
  partialBlock.pool = this_00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_6d8,
             msg_00);
  _cVar25 = 0x2d2122;
  RVar7 = PartiallyDownloadedBlock::InitData(&partialBlock,&shortIDs2,&empty_extra_txn);
  block2.super_CBlockHeader.nVersion._0_1_ = RVar7 == READ_STATUS_OK;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader._0_8_ = anon_var_dwarf_47b869;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       (long)"partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK" + 0x43;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6e0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)&block3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar25,
             (size_t)&local_6e8,0xaf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6f0 = (_Base_ptr)0xe8e58a;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb0;
  file_01.m_begin = (iterator)&local_6f8;
  msg_01.m_end = pvVar17;
  msg_01.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_708,
             msg_01);
  _cVar25 = 0x2d2202;
  bVar6 = PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,0);
  block2.super_CBlockHeader.nVersion._0_1_ = !bVar6;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader._0_8_ = anon_var_dwarf_47b98d;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       (long)"!partialBlock.IsTxAvailable(0)" + 0x1e;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_710 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)&block3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar25,
             (size_t)&local_718,0xb0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_720 = (_Base_ptr)0xe8e58a;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xb1;
  file_02.m_begin = (iterator)&local_728;
  msg_02.m_end = pvVar17;
  msg_02.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_738,
             msg_02);
  _cVar25 = 0x2d22e4;
  block2.super_CBlockHeader.nVersion._0_1_ =
       PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,1);
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader._0_8_ = (long)"!partialBlock.IsTxAvailable(1)" + 1;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       (long)"!partialBlock.IsTxAvailable(1)" + 0x1e;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_740 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)&block3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar25,
             (size_t)&local_748,0xb1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_750 = (pointer)0xe8e58a;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xb2;
  file_03.m_begin = (iterator)&local_758;
  msg_03.m_end = pvVar17;
  msg_03.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_768,
             msg_03);
  _cVar25 = 0x2d23c4;
  block2.super_CBlockHeader.nVersion._0_1_ =
       PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,2);
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ = "";
  block3.super_CBlockHeader._0_8_ = "partialBlock.IsTxAvailable(2)";
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_770 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)&block3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar25,
             (size_t)&local_778,0xb2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xb4;
  file_04.m_begin = (iterator)&local_788;
  msg_04.m_end = pvVar17;
  msg_04.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_798,
             msg_04);
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013d3cb0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = "";
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  CTxMemPool::get((CTxMemPool *)local_890,(uint256 *)this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_890._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_598._0_8_ = (pointer)0x0;
  }
  else {
    local_598._0_8_ = SEXT48(*(_Atomic_word *)(local_890._8_8_ + 8));
  }
  local_558._0_8_ = local_598;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((pointer)local_598._0_8_ == (pointer)0x5);
  local_578._M_p = local_5b8;
  local_5b8._0_8_ = 5;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x24;
  local_5f8._1_7_ = 0xe8e5;
  local_5f8.m_message.px._0_1_ = 0x8a;
  local_5f8.m_message.px._1_7_ = 0xe8e5;
  partialBlockCopy.prefilled_count = (size_t)local_558;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4050;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_578;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.nVersion._0_1_ = 0x50;
  block2.super_CBlockHeader._1_7_ = 0x13d40;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&block3,1,2,REQUIRE,0xe8e5ba,(size_t)&local_5f8,0xb4,
             &partialBlockCopy,"SHARED_TX_OFFSET + 1",&block2);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_890._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_890._8_8_);
  }
  block2.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block2.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  block2.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block2.super_CBlockHeader.nTime = 0;
  block2.super_CBlockHeader.nBits = 0;
  block2.super_CBlockHeader.nNonce = 0;
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader._1_7_ = 0;
  block2.super_CBlockHeader.nVersion._0_1_ = 0;
  block2.fChecked = false;
  block2.m_checked_witness_commitment = false;
  block2.m_checked_merkle_root = false;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&partialBlockCopy.txn_available,&partialBlock.txn_available);
  psVar13 = &partialBlock.prefilled_count;
  psVar12 = psVar13;
  psVar14 = &partialBlockCopy.prefilled_count;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    *psVar14 = *psVar12;
    psVar12 = psVar12 + (ulong)bVar22 * -2 + 1;
    psVar14 = psVar14 + (ulong)bVar22 * -2 + 1;
  }
  pCVar18 = &partialBlockCopy.m_check_block_mock;
  __x = &partialBlock.m_check_block_mock;
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(pCVar18,__x);
  local_7a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7a0 = "";
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xb9;
  file_05.m_begin = (iterator)&local_7a8;
  msg_05.m_end = pvVar17;
  msg_05.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_7b8,
             msg_05);
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_5f8._1_7_ = 0;
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _cVar25 = 0x2d277b;
  RVar7 = PartiallyDownloadedBlock::FillBlock
                    (&partialBlock,&block2,
                     (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)&local_5f8);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar7 == READ_STATUS_INVALID);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890._0_8_ = "partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID";
  local_890._8_8_ = "";
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013d3df0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = local_890;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7c0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&block3,1,0,WARN,_cVar25,(size_t)&local_7c8,0xb9);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_5f8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator=(&partialBlock.txn_available,&partialBlockCopy.txn_available);
  psVar12 = &partialBlockCopy.prefilled_count;
  psVar14 = psVar13;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    *psVar14 = *psVar12;
    psVar12 = psVar12 + (ulong)bVar22 * -2 + 1;
    psVar14 = psVar14 + (ulong)bVar22 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  operator=(__x,pCVar18);
  if (partialBlockCopy.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlockCopy.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)pCVar18,(_Any_data *)pCVar18,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlockCopy.txn_available);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&partialBlockCopy.txn_available,&partialBlock.txn_available);
  psVar12 = psVar13;
  psVar14 = &partialBlockCopy.prefilled_count;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    *psVar14 = *psVar12;
    psVar12 = psVar12 + (ulong)bVar22 * -2 + 1;
    psVar14 = psVar14 + (ulong)bVar22 * -2 + 1;
  }
  pCVar18 = &partialBlockCopy.m_check_block_mock;
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(pCVar18,__x);
  local_58._0_8_ =
       block.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (element_type *)
           block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.m_message.px = peVar4;
  if (peVar4 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               &(peVar4->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               &(peVar4->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&block3,__l,(allocator_type *)&local_5f8);
  PartiallyDownloadedBlock::FillBlock
            (&partialBlock,&block2,
             (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&block3);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&block3);
  if (local_58.m_message.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_message.px);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator=(&partialBlock.txn_available,&partialBlockCopy.txn_available);
  psVar12 = &partialBlockCopy.prefilled_count;
  psVar14 = psVar13;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    *psVar14 = *psVar12;
    psVar12 = psVar12 + (ulong)bVar22 * -2 + 1;
    psVar14 = psVar14 + (ulong)bVar22 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  operator=(__x,pCVar18);
  if (partialBlockCopy.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlockCopy.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)pCVar18,(_Any_data *)pCVar18,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlockCopy.txn_available);
  local_7d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7d0 = "";
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xc3;
  file_06.m_begin = (iterator)&local_7d8;
  msg_06.m_end = pvVar17;
  msg_06.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_7e8,
             msg_06);
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)0xf98c4c;
  CTxMemPool::get((CTxMemPool *)local_558,(uint256 *)this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_5b8._0_8_ = 0;
  }
  else {
    local_5b8._0_8_ = SEXT48(*(_Atomic_word *)(local_558._8_8_ + 8));
  }
  local_598._0_8_ = &local_618;
  local_618._0_8_ = (string **)0x6;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_5b8._0_8_ == 6);
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_890._8_8_ = "";
  local_578._M_p = local_5b8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4050;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  partialBlockCopy.prefilled_count = (size_t)&local_578;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013d4050;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = local_598;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_5f8,(lazy_ostream *)&local_58,1,2,REQUIRE,0xe8e5ba,(size_t)local_890,0xc3,
             &partialBlockCopy,"SHARED_TX_OFFSET + 2",&block3);
  boost::detail::shared_count::~shared_count(&local_5f8.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
  }
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808.member =
       (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
        *)&boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xc5;
  file_07.m_begin = (iterator)&local_800;
  msg_07.m_end = pvVar17;
  msg_07.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_810,
             msg_07);
  _cVar25 = 0x2d2bc5;
  BlockMerkleRoot((uint256 *)&partialBlockCopy,&block2,&mutated);
  auVar24[0] = -((uchar)partialBlockCopy.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0]);
  auVar24[1] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1]);
  auVar24[2] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._2_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2]);
  auVar24[3] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._3_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3]);
  auVar24[4] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4]);
  auVar24[5] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._5_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5]);
  auVar24[6] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._6_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6]);
  auVar24[7] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._7_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7]);
  auVar24[8] = -((uchar)partialBlockCopy.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8]);
  auVar24[9] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9]);
  auVar24[10] = -(partialBlockCopy.txn_available.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                 block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10]);
  auVar24[0xb] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb]
                  );
  auVar24[0xc] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc]
                  );
  auVar24[0xd] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd]
                  );
  auVar24[0xe] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe]
                  );
  auVar24[0xf] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf]
                  );
  auVar23[0] = -((uchar)partialBlockCopy.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10])
  ;
  auVar23[1] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11])
  ;
  auVar23[2] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12])
  ;
  auVar23[3] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13])
  ;
  auVar23[4] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14])
  ;
  auVar23[5] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15])
  ;
  auVar23[6] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16])
  ;
  auVar23[7] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17])
  ;
  auVar23[8] = -((uchar)partialBlockCopy.prefilled_count ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18])
  ;
  auVar23[9] = -(partialBlockCopy.prefilled_count._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19])
  ;
  auVar23[10] = -(partialBlockCopy.prefilled_count._2_1_ ==
                 block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a]
                 );
  auVar23[0xb] = -(partialBlockCopy.prefilled_count._3_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1b]);
  auVar23[0xc] = -(partialBlockCopy.prefilled_count._4_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1c]);
  auVar23[0xd] = -(partialBlockCopy.prefilled_count._5_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1d]);
  auVar23[0xe] = -(partialBlockCopy.prefilled_count._6_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1e]);
  auVar23[0xf] = -(partialBlockCopy.prefilled_count._7_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1f]);
  auVar23 = auVar23 & auVar24;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xe6;
  local_5f8._1_7_ = 0xe8e6;
  local_5f8.m_message.px._0_1_ = 0x1f;
  local_5f8.m_message.px._1_7_ = 0xe8e7;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013d3df0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_5f8;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_820[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_820[1] = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)&block3,1,0,WARN,_cVar25,(size_t)local_820,0xc5);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  block3.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block3.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  block3.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block3.super_CBlockHeader.nTime = 0;
  block3.super_CBlockHeader.nBits = 0;
  block3.super_CBlockHeader.nNonce = 0;
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block3.super_CBlockHeader.nVersion = 0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block3.fChecked = false;
  block3.m_checked_witness_commitment = false;
  block3.m_checked_merkle_root = false;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&partialBlockCopy.txn_available,&partialBlock.txn_available);
  psVar12 = &partialBlockCopy.prefilled_count;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    *psVar12 = *psVar13;
    psVar13 = psVar13 + (ulong)bVar22 * -2 + 1;
    psVar12 = psVar12 + (ulong)bVar22 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(&partialBlockCopy.m_check_block_mock,__x);
  local_830[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_830[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
                         + 0x66);
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = (undefined1  [8])&boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xc9;
  file_08.m_begin = (iterator)local_830;
  msg_08.m_end = pvVar17;
  msg_08.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_840,
             msg_08);
  local_558._0_8_ =
       ((block.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_558._8_8_ =
       ((block.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((element_type *)local_558._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               &(((element_type *)local_558._8_8_)->m_stream).
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               &(((element_type *)local_558._8_8_)->m_stream).
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
    }
  }
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_558;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_890,__l_00,(allocator_type *)local_598);
  _cVar25 = 0x2d2e25;
  RVar7 = PartiallyDownloadedBlock::FillBlock
                    (&partialBlock,&block3,
                     (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_890);
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(RVar7 == READ_STATUS_OK);
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._M_p = "partialBlock.FillBlock(block3, {block.vtx[0]}) == READ_STATUS_OK";
  local_570 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xe8e87e;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&local_578;
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_848 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_5f8,(lazy_ostream *)&local_58,1,0,WARN,_cVar25,(size_t)&local_850,0xc9);
  boost::detail::shared_count::~shared_count(&local_5f8.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_890);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
  }
  local_860 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_858 = "";
  local_890._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_890._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xca;
  file_09.m_begin = (iterator)&local_860;
  msg_09.m_end = pvVar17;
  msg_09.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
             (size_t)(local_890 + 0x20),msg_09);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  CBlockHeader::GetHash((uint256 *)&local_578,&block.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_558,&local_578);
  CBlockHeader::GetHash((uint256 *)local_5b8,&block3.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_598,local_5b8);
  if (local_558._8_8_ == local_598._8_8_) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar6 = true;
    }
    else {
      iVar8 = bcmp((void *)local_558._0_8_,(void *)local_598._0_8_,local_558._8_8_);
      bVar6 = iVar8 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  local_618.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar6;
  local_618.m_message.px = (element_type *)0x0;
  local_618.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_628 = (string *)0xe8e524;
  local_620 = "";
  local_40 = (lazy_ostream *)&local_600;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = &local_630;
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x70;
  local_5f8._1_7_ = 0x13d3d;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  local_630 = (string *)local_598;
  local_600 = (string *)local_558;
  boost::test_tools::tt_detail::report_assertion
            (&local_618,(lazy_ostream *)local_890,1,2,REQUIRE,0xe8e761,(size_t)&local_628,0xca,
             (lazy_ostream *)&local_58,"block3.GetHash().ToString()",&local_5f8);
  boost::detail::shared_count::~shared_count(&local_618.m_message.pn);
  if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
    operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._0_8_ != &aStack_548) {
    operator_delete((void *)local_558._0_8_,aStack_548._M_allocated_capacity + 1);
  }
  local_8a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xcb;
  file_10.m_begin = (iterator)&local_8a0;
  msg_10.m_end = pvVar17;
  msg_10.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_8b0,
             msg_10);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_558,&block.super_CBlockHeader.hashMerkleRoot)
  ;
  BlockMerkleRoot((uint256 *)local_598,&block3,&mutated);
  base_blob<256u>::ToString_abi_cxx11_((string *)&local_578,local_598);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ == local_570) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      rVar21.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar8 = bcmp((void *)local_558._0_8_,local_578._M_p,local_558._8_8_);
      rVar21.super_class_property<bool>.value = (class_property<bool>)(iVar8 == 0);
    }
  }
  else {
    rVar21.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_5b8[0] = rVar21.super_class_property<bool>.value;
  local_5b8._8_8_ = (element_type *)0x0;
  asStack_5a8[0].pi_ = (sp_counted_base *)0x0;
  local_618._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_618.m_message.px = (element_type *)0xe8e58a;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)&local_628;
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x70;
  local_5f8._1_7_ = 0x13d3d;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = &local_600;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  local_628 = (string *)local_558;
  local_600 = (string *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_5b8,(lazy_ostream *)local_890,1,2,REQUIRE,0xe8e798,
             (size_t)&local_618,0xcb,(lazy_ostream *)&local_58,
             "BlockMerkleRoot(block3, &mutated).ToString()",&local_5f8);
  boost::detail::shared_count::~shared_count(asStack_5a8);
  if ((string *)local_578._M_p != (string *)&local_568) {
    operator_delete(local_578._M_p,local_568._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._0_8_ != &aStack_548) {
    operator_delete((void *)local_558._0_8_,aStack_548._M_allocated_capacity + 1);
  }
  local_8c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar25 = 0x2d3379;
  file_11.m_end = (iterator)0xcc;
  file_11.m_begin = (iterator)&local_8c0;
  msg_11.m_end = pvVar17;
  msg_11.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_8d0,
             msg_11);
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(mutated ^ 1);
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890._0_8_ = "!mutated";
  local_890._8_8_ = "";
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_8e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_8d8 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  local_40 = (lazy_ostream *)local_890;
  boost::test_tools::tt_detail::report_assertion
            (&local_5f8,(lazy_ostream *)&local_58,1,0,WARN,_cVar25,(size_t)&local_8e0,0xcc);
  boost::detail::shared_count::~shared_count(&local_5f8.m_message.pn);
  local_8f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xce;
  file_12.m_begin = (iterator)&local_8f0;
  msg_12.m_end = pvVar17;
  msg_12.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_900,
             msg_12);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  CTxMemPool::get((CTxMemPool *)local_598,(uint256 *)this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_628 = (string *)0x0;
  }
  else {
    local_628 = (string *)(long)*(_Atomic_word *)(local_598._8_8_ + 8);
  }
  local_600 = (string *)0x7;
  local_558[0] = local_628 == (string *)0x7;
  local_558._8_8_ = (element_type *)0x0;
  aStack_548._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_578._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_570 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xe8e58a;
  local_5b8._0_8_ = &local_628;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013d4050;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)local_5b8;
  local_618._0_8_ = &local_600;
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x50;
  local_5f8._1_7_ = 0x13d40;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = (string **)&local_618;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_558,(lazy_ostream *)local_890,1,2,REQUIRE,0xe8e5ba,
             (size_t)&local_578,0xce,(lazy_ostream *)&local_58,"SHARED_TX_OFFSET + 3",&local_5f8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_548._M_allocated_capacity);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
  }
  peVar2 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  txhash.super_base_blob<256U>.m_data._M_elems._0_16_ =
       *(undefined1 (*) [16])(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  txhash.super_base_blob<256U>.m_data._M_elems._16_16_ =
       *(undefined1 (*) [16])
        ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  psVar19 = block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (block.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      block.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var3 = (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      psVar19 = psVar19 + 1;
    } while (psVar19 !=
             block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    block.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         block.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  psVar19 = block2.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = block2.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar20 = block2.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (block2.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      block2.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var3 = (psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      psVar20 = psVar20 + 1;
    } while (psVar20 != psVar5);
    block2.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar19;
  }
  psVar19 = block3.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = block3.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar20 = block3.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (block3.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      block3.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var3 = (psVar20->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      psVar20 = psVar20 + 1;
    } while (psVar20 != psVar5);
    block3.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar19;
  }
  local_910 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xd4;
  file_13.m_begin = (iterator)&local_910;
  msg_13.m_end = pvVar17;
  msg_13.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_920,
             msg_13);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  CTxMemPool::get((CTxMemPool *)local_598,(uint256 *)this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_628 = (string *)0x0;
  }
  else {
    local_628 = (string *)(long)*(_Atomic_word *)(local_598._8_8_ + 8);
  }
  local_600 = (string *)0x4;
  local_558[0] = local_628 == (string *)0x4;
  local_558._8_8_ = (element_type *)0x0;
  aStack_548._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_578._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_570 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xe8e58a;
  local_5b8._0_8_ = &local_628;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013d4050;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (lazy_ostream *)local_5b8;
  local_618._0_8_ = &local_600;
  local_5f8.m_message.px._0_1_ = 0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x50;
  local_5f8._1_7_ = 0x13d40;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = (string **)&local_618;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_558,(lazy_ostream *)local_890,1,2,REQUIRE,0xe8e894,
             (size_t)&local_578,0xd4,(lazy_ostream *)&local_58,"SHARED_TX_OFFSET + 1 - 1",&local_5f8
            );
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_548._M_allocated_capacity);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
  }
  if (partialBlockCopy.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlockCopy.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)&partialBlockCopy.m_check_block_mock,
               (_Any_data *)&partialBlockCopy.m_check_block_mock,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlockCopy.txn_available);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block3.vtx);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block2.vtx);
  if (partialBlock.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlock.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlock.txn_available);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs2.prefilledtxn);
  if (shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs2.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_6b8);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs.prefilledtxn);
  if (shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_930 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_928 = "";
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xd6;
  file_14.m_begin = (iterator)&local_930;
  msg_14.m_end = pvVar17;
  msg_14.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_940,
             msg_14);
  shortIDs2.shorttxidk1._0_1_ = 0;
  shortIDs2.shorttxidk0 = (uint64_t)&PTR__lazy_ostream_013d3cb0;
  shortIDs2.nonce = (uint64_t)boost::unit_test::lazy_ostream::inst;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf98c4c;
  CTxMemPool::get((CTxMemPool *)&block3,(uint256 *)this_00);
  if (block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ == 0) {
    lVar10 = 0;
  }
  else {
    lVar10 = (long)*(int *)(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems._4_8_ + 8);
  }
  local_6b8._0_8_ = lVar10;
  local_890._0_8_ = (pointer)0x3;
  shortIDs.header.nVersion._0_1_ = lVar10 == 3;
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block2.super_CBlockHeader.nVersion._0_1_ = 0x24;
  block2.super_CBlockHeader._1_7_ = 0xe8e5;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x8a;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xe5;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xe8;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4050;
  partialBlock.prefilled_count = (size_t)&local_58;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81((lazy_ostream *)local_890,0);
  local_5f8._1_7_ = SUB87((ulong)local_890 >> 8,0);
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4050;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  partialBlockCopy.prefilled_count = (size_t)&local_5f8;
  local_58._0_8_ = (element_type *)local_6b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&shortIDs,(lazy_ostream *)&shortIDs2,1,2,REQUIRE,0xe8e894,
             (size_t)&block2,0xd6,&partialBlock,"SHARED_TX_OFFSET - 1",&partialBlockCopy);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  if (block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  ChaCha20::~ChaCha20(&rand_ctx.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(NonCoinbasePreforwardRTTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[2]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    uint256 txhash;

    // Test with pre-forwarding tx 1, but not coinbase
    {
        TestHeaderAndShortIDs shortIDs(block, rand_ctx);
        shortIDs.prefilledtxn.resize(1);
        shortIDs.prefilledtxn[0] = {1, block.vtx[1]};
        shortIDs.shorttxids.resize(2);
        shortIDs.shorttxids[0] = shortIDs.GetShortID(block.vtx[0]->GetWitnessHash());
        shortIDs.shorttxids[1] = shortIDs.GetShortID(block.vtx[2]->GetWitnessHash());

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK(!partialBlock.IsTxAvailable(0));
        BOOST_CHECK( partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 1); // +1 because of partialBlock

        CBlock block2;
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID); // No transactions
            partialBlock = tmp;
        }

        // Wrong transaction
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            partialBlock.FillBlock(block2, {block.vtx[1]}); // Current implementation doesn't check txn here, but don't require that
            partialBlock = tmp;
        }
        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 2); // +2 because of partialBlock and block2
        bool mutated;
        BOOST_CHECK(block.hashMerkleRoot != BlockMerkleRoot(block2, &mutated));

        CBlock block3;
        PartiallyDownloadedBlock partialBlockCopy = partialBlock;
        BOOST_CHECK(partialBlock.FillBlock(block3, {block.vtx[0]}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block3.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block3, &mutated).ToString());
        BOOST_CHECK(!mutated);

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 3); // +2 because of partialBlock and block2 and block3

        txhash = block.vtx[2]->GetHash();
        block.vtx.clear();
        block2.vtx.clear();
        block3.vtx.clear();
        BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET + 1 - 1); // + 1 because of partialBlock; -1 because of block.
    }
    BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET - 1); // -1 because of block
}